

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O3

string * dpfb::str::format_abi_cxx11_(string *__return_storage_ptr__,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args2;
  va_list args1;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_f8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_100 = &args2[0].overflow_arg_area;
  local_e8 = 0x3000000010;
  local_108 = 0x3000000010;
  local_e0 = local_100;
  local_d8 = local_f8;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  iVar1 = vsnprintf((char *)0x0,0,fmt,&local_e8);
  if (iVar1 < 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)iVar1 + '\x01');
    vsnprintf((__return_storage_ptr__->_M_dataplus)._M_p,__return_storage_ptr__->_M_string_length,
              fmt,&local_108);
    std::__cxx11::string::pop_back();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, ...)
{
    va_list args1;
    va_start(args1, fmt);
    va_list args2;
    va_copy(args2, args1);

    const auto size = std::vsnprintf(nullptr, 0, fmt, args1);
    va_end(args1);
    if (size <= 0) {
        va_end(args2);
        return "";
    }

    std::string result;
    result.resize(size + 1);
    std::vsnprintf(&result[0], result.length(), fmt, args2);
    va_end(args2);

    result.pop_back();
    return result;
}